

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_end(nk_context *ctx)

{
  nk_command_buffer *b;
  nk_property_state *__s;
  nk_edit_state *__s_00;
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ushort uVar10;
  nk_panel_type nVar11;
  undefined4 uVar12;
  uint uVar13;
  nk_window *pnVar14;
  nk_panel *pnVar15;
  nk_panel *pnVar16;
  nk_window *pnVar17;
  nk_scroll *pnVar18;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var19;
  nk_size nVar20;
  nk_size nVar21;
  nk_size nVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  nk_panel *pnVar26;
  int iVar27;
  uint uVar28;
  long lVar29;
  void *pvVar30;
  uint *puVar31;
  nk_panel *pnVar32;
  nk_page_data *pd;
  nk_window *pnVar33;
  nk_page_element *elem;
  nk_context *in;
  ulong uVar34;
  bool bVar35;
  float fVar36;
  nk_vec2 nVar37;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float scroll_step;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect scroll;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect r_00;
  nk_flags state;
  nk_rect empty_east;
  nk_flags local_fc;
  float local_f8;
  float fStack_f4;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  nk_rect local_d8;
  float local_c8;
  float fStack_c4;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  nk_rect local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  ulong local_68;
  undefined8 uStack_60;
  nk_rect local_50;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    return;
  }
  pnVar14 = ctx->current;
  if (pnVar14 == (nk_window *)0x0) {
    return;
  }
  if ((pnVar14->flags & 0x1000) != 0) goto LAB_00110bac;
  pnVar15 = pnVar14->layout;
  if (pnVar15 == (nk_panel *)0x0) {
    elem = (nk_page_element *)0x0;
  }
  else {
    b = &pnVar14->buffer;
    nVar11 = pnVar15->type;
    uVar28 = pnVar15->flags;
    in = (nk_context *)0x0;
    if ((uVar28 >> 0xb & 1) == 0) {
      in = ctx;
    }
    if ((nVar11 & (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
                  NK_PANEL_GROUP)) == 0) {
      r.w = 16384.0;
      r.h = 16384.0;
      r.x = -8192.0;
      r.y = -8192.0;
      nk_push_scissor(b,r);
      nVar11 = pnVar15->type;
      uVar28 = pnVar15->flags;
    }
    nVar37 = (ctx->style).window.scrollbar_size;
    local_f8 = nVar37.x;
    fStack_f4 = nVar37.y;
    uStack_f0 = 0;
    local_e8._0_8_ = &ctx->style;
    nVar37 = nk_panel_get_padding(&ctx->style,nVar11);
    local_c8 = nVar37.x;
    fStack_c4 = nVar37.y;
    fVar36 = (pnVar15->row).height + pnVar15->at_y;
    pnVar15->at_y = fVar36;
    uStack_c0 = extraout_XMM0_Qb;
    if ((uVar28 & 0x4400) == 0x400) {
      fVar48 = (pnVar15->bounds).y;
      if (fVar36 < (pnVar15->bounds).h + fVar48) {
        (pnVar15->bounds).h = fVar36 - fVar48;
      }
      rect.y = fVar48;
      rect.x = (pnVar14->bounds).x;
      auVar40._8_8_ = extraout_XMM0_Qb;
      auVar40._0_4_ = nVar37.x;
      auVar40._4_4_ = nVar37.y;
      auVar45._4_12_ = auVar40._4_12_;
      auVar45._0_4_ = (pnVar14->bounds).w;
      rect._8_8_ = auVar45._0_8_;
      nk_fill_rect(b,rect,0.0,(ctx->style).window.background);
      rect_00.w = pnVar15->border + local_c8;
      rect_00.h = (pnVar15->bounds).h;
      rect_00.y = (pnVar15->bounds).y;
      rect_00.x = (pnVar14->bounds).x;
      nk_fill_rect(b,rect_00,0.0,(ctx->style).window.background);
      rect_01.x = ((pnVar15->bounds).x + (pnVar15->bounds).w) - pnVar15->border;
      rect_01.y = (pnVar15->bounds).y;
      fVar48 = pnVar15->border + local_c8;
      fVar36 = (pnVar15->bounds).h;
      auVar46._4_4_ = fVar36;
      auVar46._0_4_ = fVar48;
      auVar46._8_8_ = 0;
      if ((pnVar15->offset->y == 0) && ((pnVar15->flags & 0x20) == 0)) {
        auVar46._0_4_ = fVar48 + local_f8;
        auVar46._8_8_ = 0;
      }
      rect_01._8_8_ = auVar46._0_8_;
      nk_fill_rect(b,rect_01,0.0,(ctx->style).window.background);
      uVar28 = pnVar15->flags;
      if ((uVar28 & 0x20) == 0 && pnVar15->offset->x != 0) {
        rect_02.y = (pnVar15->bounds).y + (pnVar15->bounds).h;
        rect_02.x = (pnVar14->bounds).x;
        auVar24._4_4_ = fStack_f4;
        auVar24._0_4_ = local_f8;
        auVar24._8_8_ = uStack_f0;
        auVar47._4_12_ = auVar24._4_12_;
        auVar47._0_4_ = (pnVar14->bounds).w;
        rect_02._8_8_ = auVar47._0_8_;
        nk_fill_rect(b,rect_02,0.0,(ctx->style).window.background);
        uVar28 = pnVar15->flags;
      }
    }
    if (((uVar28 & 0x4020) == 0) &&
       (pnVar14->scrollbar_hiding_timer <= 4.0 && pnVar14->scrollbar_hiding_timer != 4.0)) {
      local_d8._0_8_ = local_d8._0_8_ & 0xffffffff00000000;
      fVar36 = (pnVar15->bounds).y;
      scroll.x = (pnVar15->bounds).x + (pnVar15->bounds).w + local_c8;
      scroll.y = fVar36;
      fVar48 = (pnVar15->bounds).h;
      uVar10 = pnVar15->offset->y;
      scroll.h = fVar48;
      scroll.w = local_f8;
      fVar49 = pnVar15->at_y;
      if ((pnVar15->type &
          (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
          NK_PANEL_GROUP)) == 0) {
        if (pnVar14 == ctx->active) {
          bVar35 = pnVar15->has_scrolling != 0;
        }
        else {
          bVar35 = false;
        }
        if ((in == (nk_context *)0x0) || ((0.0 < (in->input).mouse.scroll_delta & bVar35) != 1)) {
          pnVar14->scrolled = 0;
        }
        else {
          pnVar14->scrolled = 1;
LAB_0010ffb8:
          bVar35 = true;
        }
      }
      else {
        pnVar16 = pnVar14->layout;
        pnVar26 = pnVar16;
        do {
          pnVar32 = pnVar26;
          pnVar26 = pnVar32->parent;
          pnVar17 = pnVar14;
        } while (pnVar32->parent != (nk_panel *)0x0);
        do {
          pnVar33 = pnVar17;
          pnVar17 = pnVar33->parent;
        } while (pnVar17 != (nk_window *)0x0);
        if (((pnVar33 == ctx->active) && (pnVar15->has_scrolling != 0)) && (in != (nk_context *)0x0)
           ) {
          uVar2 = (pnVar15->bounds).x;
          uVar6 = (pnVar15->bounds).y;
          fVar51 = (in->input).mouse.pos.x;
          bVar35 = false;
          if ((float)uVar2 <= fVar51) {
            uVar3 = (pnVar15->bounds).w;
            uVar7 = (pnVar15->bounds).h;
            if (fVar51 <= (float)uVar2 + (float)uVar3) {
              fVar51 = (in->input).mouse.pos.y;
              bVar35 = false;
              if (((float)uVar6 <= fVar51) && (fVar51 <= (float)uVar6 + (float)uVar7)) {
                fVar51 = (pnVar32->clip).x;
                if (((fVar51 <= (float)uVar2 + (float)uVar3) &&
                    (((float)uVar2 <= fVar51 + (pnVar32->clip).w &&
                     (fVar51 = (pnVar32->clip).y, fVar51 <= fVar48 + fVar36)))) &&
                   (fVar36 <= fVar51 + (pnVar32->clip).h)) {
                  for (pnVar26 = pnVar16->parent; pnVar26 != (nk_panel *)0x0;
                      pnVar26 = pnVar26->parent) {
                    pnVar16->has_scrolling = 0;
                    pnVar16 = pnVar26;
                  }
                  pnVar16->has_scrolling = 0;
                  goto LAB_0010ffb8;
                }
                goto LAB_0010fe79;
              }
            }
          }
        }
        else {
LAB_0010fe79:
          bVar35 = false;
        }
      }
      fVar36 = nk_do_scrollbarv((nk_flags *)&local_d8,b,scroll,(uint)bVar35,(float)uVar10,
                                (float)(int)(fVar49 - fVar36),fVar48 * 0.1,fVar48 * 0.01,
                                &(ctx->style).scrollv,&in->input,(ctx->style).font);
      pnVar18 = pnVar15->offset;
      pnVar18->y = (unsigned_short)(int)fVar36;
      if ((in != (nk_context *)0x0) && (bVar35 != false)) {
        (in->input).mouse.scroll_delta = 0.0;
      }
      local_fc = 0;
      fVar36 = (pnVar15->bounds).x;
      fVar51 = (pnVar15->bounds).y + (pnVar15->bounds).h;
      bounds._0_8_ = CONCAT44(fVar51,fVar36);
      fVar48 = pnVar15->max_x;
      fVar49 = (float)(int)(fVar48 - fVar36);
      font = (ctx->style).font;
      local_d8.h = 1.0;
      if (1.0 <= fStack_f4) {
        local_d8.h = fStack_f4;
      }
      fVar52 = local_d8.h + local_d8.h;
      fVar50 = (pnVar15->bounds).w;
      fVar44 = fVar52;
      if (fVar52 <= fVar50) {
        fVar44 = fVar50;
      }
      local_d8._0_8_ = bounds._0_8_;
      local_d8.w = fVar44;
      fVar50 = 0.0;
      if (fVar44 < fVar49) {
        fVar50 = (float)pnVar18->x;
        scroll_step = fVar48 * 0.05;
        local_50.y = fVar51;
        local_50.h = local_d8.h;
        if ((ctx->style).scrollh.show_buttons != 0) {
          local_78 = ZEXT416((uint)fVar52);
          local_98 = ZEXT416((uint)fVar51);
          fVar51 = scroll_step;
          if (fVar48 * 0.005 <= scroll_step) {
            fVar51 = fVar48 * 0.005;
          }
          local_b8 = ZEXT416((uint)local_d8.h);
          local_88 = CONCAT412(local_d8.h,CONCAT48(local_d8.h,CONCAT44(local_d8.h,local_d8.h)));
          uStack_60 = 0;
          bounds.w = local_d8.h;
          bounds.h = local_d8.h;
          local_68 = bounds._0_8_;
          iVar27 = nk_do_button_symbol((nk_flags *)&local_a8,b,bounds,
                                       (ctx->style).scrollh.dec_symbol,NK_BUTTON_REPEATER,
                                       &(ctx->style).scrollh.dec_button,&in->input,font);
          auVar40 = local_88;
          fVar48 = 0.0;
          if (iVar27 != 0) {
            fVar48 = fVar51;
          }
          fVar50 = fVar50 - fVar48;
          fVar48 = fVar36 + fVar44;
          fVar44 = fVar44 - (float)local_78._0_4_;
          auVar25._8_8_ = uStack_60;
          auVar25._0_8_ = local_68;
          auVar38._4_12_ = auVar25._4_12_;
          auVar38._0_4_ = fVar48 - (float)local_b8._0_4_;
          bounds_00._0_8_ = auVar38._0_8_;
          bounds_00.w = (float)local_88._0_4_;
          bounds_00.h = (float)local_88._4_4_;
          local_88 = auVar40;
          iVar27 = nk_do_button_symbol((nk_flags *)&local_a8,b,bounds_00,
                                       (ctx->style).scrollh.inc_symbol,NK_BUTTON_REPEATER,
                                       &(ctx->style).scrollh.inc_button,&in->input,font);
          if (iVar27 != 0) {
            fVar50 = fVar50 + fVar51;
          }
          fVar36 = fVar36 + (float)local_b8._0_4_;
          local_d8.x = fVar36;
          local_50.y = (float)local_98._0_4_;
          local_50.h = (float)local_b8._0_4_;
        }
        if (fVar44 <= scroll_step) {
          scroll_step = fVar44;
        }
        if (fVar49 - fVar44 <= fVar50) {
          fVar50 = fVar49 - fVar44;
        }
        fVar48 = 0.0;
        if (0.0 <= fVar50) {
          fVar48 = fVar50;
        }
        fVar51 = (ctx->style).scrollh.border;
        nVar37 = (ctx->style).scrollh.padding;
        fVar50 = nVar37.x;
        fVar52 = nVar37.y;
        local_a8.x = (fVar48 / fVar49) * fVar44 + fVar36 + fVar51 + fVar50;
        local_a8.y = local_50.y + fVar51 + fVar52;
        local_a8.w = (fVar44 / fVar49) * fVar44 - (fVar50 + fVar50 + fVar51 + fVar51);
        local_a8.h = local_50.h - (fVar52 + fVar52 + fVar51 + fVar51);
        local_50.x = local_a8.w + local_a8.x;
        local_40.w = local_a8.x - fVar36;
        local_50.w = (fVar36 + fVar44) - local_50.x;
        local_d8.w = fVar44;
        local_40.x = fVar36;
        local_40.y = local_50.y;
        local_40.h = local_50.h;
        fVar48 = nk_scrollbar_behavior
                           (&local_fc,&in->input,0,&local_d8,&local_a8,&local_40,&local_50,fVar48,
                            fVar49,scroll_step,NK_HORIZONTAL);
        local_b8._0_4_ = fVar48;
        local_a8.x = (fVar48 / fVar49) * fVar44 + fVar36;
        p_Var19 = (ctx->style).scrollh.draw_begin;
        if (p_Var19 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
          (*p_Var19)(b,(ctx->style).scrollh.userdata);
        }
        nk_draw_scrollbar(b,local_fc,&(ctx->style).scrollh,&local_d8,&local_a8);
        p_Var19 = (ctx->style).scrollh.draw_end;
        if (p_Var19 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
          (*p_Var19)(b,(ctx->style).scrollh.userdata);
        }
        fVar50 = (float)local_b8._0_4_;
      }
      pnVar15->offset->x = (unsigned_short)(int)fVar50;
    }
    if ((pnVar14->flags & 0x80) == 0) {
LAB_001103fa:
      pnVar14->scrollbar_hiding_timer = 0.0;
    }
    else {
      if ((((ctx->input).mouse.delta.x != 0.0) ||
          (fVar36 = (ctx->input).mouse.delta.y, fVar36 != 0.0)) || (NAN(fVar36))) {
        bVar35 = false;
      }
      else {
        bVar35 = (ctx->input).mouse.scroll_delta == 0.0;
      }
      pnVar17 = ctx->current;
      if (pnVar17 == (nk_window *)0x0) {
LAB_00110476:
        bVar23 = false;
LAB_00110478:
        if ((bVar23) || ((ctx->last_widget_state & 2) != 0)) goto LAB_001103fa;
      }
      else {
        uVar4 = (pnVar17->bounds).x;
        uVar8 = (pnVar17->bounds).y;
        fVar36 = (ctx->input).mouse.pos.x;
        bVar23 = false;
        if ((fVar36 < (float)uVar4) ||
           (uVar5 = (pnVar17->bounds).w, uVar9 = (pnVar17->bounds).h,
           (float)uVar4 + (float)uVar5 < fVar36)) goto LAB_00110478;
        fVar36 = (ctx->input).mouse.pos.y;
        if (fVar36 < (float)uVar8) goto LAB_00110476;
        bVar23 = fVar36 <= (float)uVar8 + (float)uVar9;
        if (!(bool)(bVar35 & bVar23)) goto LAB_00110478;
      }
      pnVar14->scrollbar_hiding_timer = ctx->delta_time_seconds + pnVar14->scrollbar_hiding_timer;
    }
    uVar28 = pnVar15->flags;
    if ((uVar28 & 1) != 0) {
      nVar11 = pnVar15->type;
      lVar29 = 0x1cc4;
      if ((int)nVar11 < 0x20) {
        if (nVar11 == NK_PANEL_GROUP) {
          lVar29 = 0x1cd8;
        }
        else if (nVar11 == NK_PANEL_POPUP) {
          lVar29 = 0x1cc8;
        }
        else if (nVar11 == NK_PANEL_CONTEXTUAL) {
          lVar29 = 0x1cd0;
        }
      }
      else if (nVar11 == NK_PANEL_COMBO) {
        lVar29 = 0x1ccc;
      }
      else if ((nVar11 == NK_PANEL_MENU) || (nVar11 == NK_PANEL_TOOLTIP)) {
        lVar29 = 0x1cd4;
      }
      if ((uVar28 >> 0xe & 1) == 0) {
        if ((uVar28 >> 10 & 1) == 0) {
          fVar36 = (pnVar14->bounds).y;
          fVar48 = (pnVar14->bounds).h + fVar36;
        }
        else {
          fVar48 = (pnVar15->bounds).y + (pnVar15->bounds).h + pnVar15->footer_height;
          fVar36 = (pnVar14->bounds).y;
        }
      }
      else {
        fVar36 = (pnVar14->bounds).y;
        fVar48 = (ctx->style).window.border + fVar36 + pnVar15->header_height;
      }
      uVar12 = *(undefined4 *)(local_e8._0_8_ + lVar29);
      local_e8 = ZEXT416((uint)(pnVar14->bounds).x);
      fVar49 = (pnVar14->bounds).w;
      fVar51 = pnVar15->border;
      pvVar30 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
      if (pvVar30 != (void *)0x0) {
        *(short *)((long)pvVar30 + 0x10) = (short)(int)fVar51;
        auVar39._0_4_ = (int)(float)local_e8._0_4_;
        auVar39._4_4_ = (int)fVar36;
        auVar39._8_4_ = (int)(fVar49 + (float)local_e8._0_4_);
        auVar39._12_4_ = (int)fVar36;
        auVar40 = packssdw(auVar39,auVar39);
        *(long *)((long)pvVar30 + 0x12) = auVar40._0_8_;
        *(undefined4 *)((long)pvVar30 + 0x1a) = uVar12;
      }
      fVar36 = (pnVar14->bounds).x;
      fVar49 = (pnVar14->bounds).w;
      local_e8 = ZEXT416((uint)pnVar15->border);
      pvVar30 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
      if (pvVar30 != (void *)0x0) {
        auVar41._0_4_ = (uint)(float)local_e8._0_4_;
        auVar41._4_4_ = (int)fVar36;
        auVar41._8_4_ = (int)fVar48;
        auVar41._12_4_ = (int)(fVar49 + fVar36);
        auVar40 = packssdw(auVar41,auVar41);
        *(ulong *)((long)pvVar30 + 0x10) =
             (ulong)auVar41._0_4_ & 0xffff | auVar40._0_8_ & 0xffffffffffff0000;
        *(short *)((long)pvVar30 + 0x18) = (short)auVar41._8_4_;
        *(undefined4 *)((long)pvVar30 + 0x1a) = uVar12;
      }
      fVar36 = (pnVar14->bounds).x;
      fVar49 = (pnVar14->bounds).y;
      local_e8 = ZEXT416((uint)pnVar15->border);
      pvVar30 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
      if (pvVar30 != (void *)0x0) {
        fVar36 = (float)local_e8._0_4_ * 0.5 + fVar36;
        *(short *)((long)pvVar30 + 0x10) = (short)(int)(float)local_e8._0_4_;
        auVar42._0_4_ = (int)fVar36;
        auVar42._4_4_ = (int)fVar49;
        auVar42._8_4_ = (int)fVar36;
        auVar42._12_4_ = (int)fVar48;
        auVar40 = packssdw(auVar42,auVar42);
        *(long *)((long)pvVar30 + 0x12) = auVar40._0_8_;
        *(undefined4 *)((long)pvVar30 + 0x1a) = uVar12;
      }
      fVar36 = (pnVar14->bounds).x;
      fVar49 = (pnVar14->bounds).y;
      fVar51 = (pnVar14->bounds).w;
      local_e8 = ZEXT416((uint)pnVar15->border);
      pvVar30 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
      if (pvVar30 != (void *)0x0) {
        fVar36 = (float)local_e8._0_4_ * -0.5 + fVar36 + fVar51;
        *(short *)((long)pvVar30 + 0x10) = (short)(int)(float)local_e8._0_4_;
        auVar43._0_4_ = (int)fVar36;
        auVar43._4_4_ = (int)fVar49;
        auVar43._8_4_ = (int)fVar36;
        auVar43._12_4_ = (int)fVar48;
        auVar40 = packssdw(auVar43,auVar43);
        *(long *)((long)pvVar30 + 0x12) = auVar40._0_8_;
        *(undefined4 *)((long)pvVar30 + 0x1a) = uVar12;
      }
    }
    if (((pnVar15->flags & 0x4004) == 4) && (in != (nk_context *)0x0)) {
      fStack_c4 = (pnVar15->bounds).y + (pnVar15->bounds).h;
      local_c8 = (pnVar15->bounds).x + (pnVar15->bounds).w + local_c8;
      if ((pnVar15->flags & 0x20) != 0) {
        local_c8 = local_c8 - local_f8;
      }
      uStack_c0 = 0;
      if ((ctx->style).window.scaler.type == NK_STYLE_ITEM_IMAGE) {
        r_00.y = fStack_c4;
        r_00.x = local_c8;
        r_00.h = fStack_f4;
        r_00.w = local_f8;
        nk_draw_image(b,r_00,&(ctx->style).window.scaler.data.image,(nk_color)0xffffffff);
      }
      else {
        nk_fill_triangle(b,local_f8 + local_c8,fStack_c4,local_f8 + local_c8,fStack_f4 + fStack_c4,
                         local_c8,fStack_f4 + fStack_c4,(ctx->style).window.scaler.data.color);
      }
      if ((((((pnVar14->flags & 0x800) == 0) &&
            (fVar36 = (in->input).mouse.buttons[0].clicked_pos.x, local_c8 <= fVar36)) &&
           (fVar36 <= local_f8 + local_c8)) &&
          ((fVar36 = (in->input).mouse.buttons[0].clicked_pos.y, fStack_c4 <= fVar36 &&
           (fVar36 <= fStack_f4 + fStack_c4)))) && ((in->input).mouse.buttons[0].down == 1)) {
        fVar36 = (in->input).mouse.delta.x;
        fVar49 = (pnVar14->bounds).w + fVar36;
        fVar48 = (ctx->style).window.min_size.x;
        if (fVar49 <= fVar48) {
          fVar49 = fVar48;
        }
        fVar48 = (ctx->style).window.min_size.y;
        (pnVar14->bounds).w = fVar49;
        if ((pnVar15->flags & 0x400) == 0) {
          fVar49 = (in->input).mouse.delta.y;
          fVar51 = (pnVar14->bounds).h + fVar49;
          if (fVar51 <= fVar48) {
            fVar51 = fVar48;
          }
          (pnVar14->bounds).h = fVar51;
        }
        else {
          fVar49 = (in->input).mouse.delta.y;
        }
        (ctx->style).cursor_active = (ctx->style).cursors[6];
        nVar37.x = local_f8 * 0.5 + local_c8 + fVar36;
        nVar37.y = fStack_f4 * 0.5 + fStack_c4 + fVar49;
        (in->input).mouse.buttons[0].clicked_pos = nVar37;
      }
    }
    uVar28 = pnVar15->flags;
    if ((pnVar15->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
        NK_PANEL_GROUP)) == 0) {
      if ((uVar28 >> 0xc & 1) == 0) {
        (pnVar14->buffer).end = (ctx->memory).allocated;
        pnVar16 = pnVar14->layout;
        if ((pnVar16->popup_buffer).active != 0) {
          pvVar30 = (ctx->memory).memory.ptr;
          nVar20 = (pnVar16->popup_buffer).last;
          nVar21 = (pnVar14->buffer).last;
          nVar22 = (pnVar16->popup_buffer).end;
          *(nk_size *)((long)pvVar30 + (pnVar16->popup_buffer).parent + 8) = nVar22;
          *(undefined8 *)((long)pvVar30 + nVar20 + 8) = *(undefined8 *)((long)pvVar30 + nVar21 + 8);
          *(nk_size *)((long)pvVar30 + nVar21 + 8) = (pnVar16->popup_buffer).begin;
          (pnVar14->buffer).last = nVar20;
          (pnVar14->buffer).end = nVar22;
          (pnVar16->popup_buffer).active = 0;
        }
      }
      else {
        (pnVar14->buffer).begin = 0;
        (pnVar14->buffer).end = 0;
        (pnVar14->buffer).last = 0;
        (pnVar14->buffer).clip = nk_null_rect;
        uVar28 = pnVar15->flags;
      }
    }
    if ((short)uVar28 < 0) {
      uVar28 = uVar28 & 0xffff77ff;
      pnVar15->flags = uVar28;
    }
    pnVar14->flags = uVar28;
    iVar27 = (pnVar14->property).active;
    if (iVar27 == 0) {
      uVar28 = (pnVar14->property).seq;
LAB_00110a97:
      (pnVar14->property).old = uVar28;
      (pnVar14->property).prev = iVar27;
      (pnVar14->property).seq = 0;
    }
    else {
      uVar13 = (pnVar14->property).seq;
      uVar28 = (pnVar14->property).old;
      if ((uVar28 == uVar13) || (uVar28 = uVar13, iVar27 != (pnVar14->property).prev))
      goto LAB_00110a97;
      __s = &pnVar14->property;
      uVar34 = (ulong)__s & 3;
      if (uVar34 == 0) {
        (pnVar14->property).name = 0;
        (pnVar14->property).seq = 0;
        (pnVar14->property).old = 0;
        (pnVar14->property).state = 0;
        (pnVar14->property).buffer[0x38] = '\0';
        (pnVar14->property).buffer[0x39] = '\0';
        (pnVar14->property).buffer[0x3a] = '\0';
        (pnVar14->property).buffer[0x3b] = '\0';
        (pnVar14->property).buffer[0x3c] = '\0';
        (pnVar14->property).buffer[0x3d] = '\0';
        (pnVar14->property).buffer[0x3e] = '\0';
        (pnVar14->property).buffer[0x3f] = '\0';
        (pnVar14->property).length = 0;
        (pnVar14->property).cursor = 0;
        (pnVar14->property).buffer[0x28] = '\0';
        (pnVar14->property).buffer[0x29] = '\0';
        (pnVar14->property).buffer[0x2a] = '\0';
        (pnVar14->property).buffer[0x2b] = '\0';
        (pnVar14->property).buffer[0x2c] = '\0';
        (pnVar14->property).buffer[0x2d] = '\0';
        (pnVar14->property).buffer[0x2e] = '\0';
        (pnVar14->property).buffer[0x2f] = '\0';
        (pnVar14->property).buffer[0x30] = '\0';
        (pnVar14->property).buffer[0x31] = '\0';
        (pnVar14->property).buffer[0x32] = '\0';
        (pnVar14->property).buffer[0x33] = '\0';
        (pnVar14->property).buffer[0x34] = '\0';
        (pnVar14->property).buffer[0x35] = '\0';
        (pnVar14->property).buffer[0x36] = '\0';
        (pnVar14->property).buffer[0x37] = '\0';
        (pnVar14->property).buffer[0x18] = '\0';
        (pnVar14->property).buffer[0x19] = '\0';
        (pnVar14->property).buffer[0x1a] = '\0';
        (pnVar14->property).buffer[0x1b] = '\0';
        (pnVar14->property).buffer[0x1c] = '\0';
        (pnVar14->property).buffer[0x1d] = '\0';
        (pnVar14->property).buffer[0x1e] = '\0';
        (pnVar14->property).buffer[0x1f] = '\0';
        (pnVar14->property).buffer[0x20] = '\0';
        (pnVar14->property).buffer[0x21] = '\0';
        (pnVar14->property).buffer[0x22] = '\0';
        (pnVar14->property).buffer[0x23] = '\0';
        (pnVar14->property).buffer[0x24] = '\0';
        (pnVar14->property).buffer[0x25] = '\0';
        (pnVar14->property).buffer[0x26] = '\0';
        (pnVar14->property).buffer[0x27] = '\0';
        (pnVar14->property).buffer[8] = '\0';
        (pnVar14->property).buffer[9] = '\0';
        (pnVar14->property).buffer[10] = '\0';
        (pnVar14->property).buffer[0xb] = '\0';
        (pnVar14->property).buffer[0xc] = '\0';
        (pnVar14->property).buffer[0xd] = '\0';
        (pnVar14->property).buffer[0xe] = '\0';
        (pnVar14->property).buffer[0xf] = '\0';
        (pnVar14->property).buffer[0x10] = '\0';
        (pnVar14->property).buffer[0x11] = '\0';
        (pnVar14->property).buffer[0x12] = '\0';
        (pnVar14->property).buffer[0x13] = '\0';
        (pnVar14->property).buffer[0x14] = '\0';
        (pnVar14->property).buffer[0x15] = '\0';
        (pnVar14->property).buffer[0x16] = '\0';
        (pnVar14->property).buffer[0x17] = '\0';
        __s->active = 0;
        __s->prev = 0;
        (pnVar14->property).buffer[0] = '\0';
        (pnVar14->property).buffer[1] = '\0';
        (pnVar14->property).buffer[2] = '\0';
        (pnVar14->property).buffer[3] = '\0';
        (pnVar14->property).buffer[4] = '\0';
        (pnVar14->property).buffer[5] = '\0';
        (pnVar14->property).buffer[6] = '\0';
        (pnVar14->property).buffer[7] = '\0';
      }
      else {
        memset(__s,0,4 - uVar34);
        puVar1 = (undefined8 *)((long)__s + (4 - uVar34));
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        puVar1[4] = 0;
        puVar1[5] = 0;
        puVar1[6] = 0;
        puVar1[7] = 0;
        puVar1[8] = 0;
        puVar1[9] = 0;
        *(undefined8 *)((long)puVar1 + 0x4c) = 0;
        *(undefined8 *)((long)puVar1 + 0x54) = 0;
        memset((void *)((long)puVar1 + 0x5c),0,uVar34);
      }
    }
    iVar27 = (pnVar14->edit).active;
    if (iVar27 == 0) {
      uVar28 = (pnVar14->edit).seq;
LAB_00110b2f:
      (pnVar14->edit).old = uVar28;
      (pnVar14->edit).prev = iVar27;
      (pnVar14->edit).seq = 0;
    }
    else {
      uVar13 = (pnVar14->edit).seq;
      uVar28 = (pnVar14->edit).old;
      if ((uVar28 == uVar13) || (uVar28 = uVar13, iVar27 != (pnVar14->edit).prev))
      goto LAB_00110b2f;
      __s_00 = &pnVar14->edit;
      uVar34 = (ulong)__s_00 & 3;
      if (uVar34 == 0) {
        (pnVar14->edit).prev = 0;
        (pnVar14->edit).cursor = 0;
        (pnVar14->edit).sel_start = 0;
        (pnVar14->edit).sel_end = 0;
        __s_00->name = 0;
        __s_00->seq = 0;
        (pnVar14->edit).old = 0;
        (pnVar14->edit).active = 0;
        (pnVar14->edit).scrollbar.x = 0;
        (pnVar14->edit).scrollbar.y = 0;
        (pnVar14->edit).mode = '\0';
        (pnVar14->edit).single_line = '\0';
        *(undefined2 *)&(pnVar14->edit).field_0x26 = 0;
      }
      else {
        memset(__s_00,0,4 - uVar34);
        puVar1 = (undefined8 *)((long)__s_00 + (4 - uVar34));
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        *(undefined4 *)(puVar1 + 4) = 0;
        memset((void *)((long)puVar1 + 0x24),0,uVar34);
      }
    }
    if ((pnVar14->popup).active_con == 0) {
      uVar28 = (pnVar14->popup).con_count;
LAB_00110b7d:
      puVar31 = &(pnVar14->popup).con_count;
      (pnVar14->popup).con_old = uVar28;
    }
    else {
      uVar28 = (pnVar14->popup).con_old;
      if (uVar28 == (pnVar14->popup).con_count) goto LAB_00110b7d;
      puVar31 = &(pnVar14->popup).active_con;
      (pnVar14->popup).con_count = 0;
      (pnVar14->popup).con_old = 0;
    }
    *puVar31 = 0;
    (pnVar14->popup).combo_count = 0;
    elem = (nk_page_element *)ctx->current->layout;
  }
  nk_free_page_element(ctx,elem);
LAB_00110bac:
  ctx->current = (nk_window *)0x0;
  return;
}

Assistant:

NK_API void
nk_end(struct nk_context *ctx)
{
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current && "if this triggers you forgot to call `nk_begin`");
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current) return;
    if (ctx->current->flags & NK_WINDOW_HIDDEN) {
        ctx->current = 0;
        return;
    }
    nk_panel_end(ctx);
    nk_free_panel(ctx, ctx->current->layout);
    ctx->current = 0;
}